

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<long> * __thiscall
cimg_library::CImg<long>::assign(CImg<long> *this,uint size_x,uint size_y,uint size_z,uint size_c)

{
  long *plVar1;
  CImg<long> *pCVar2;
  CImgArgumentException *this_00;
  uint uVar3;
  char *pcVar4;
  
  uVar3 = size_z * size_c * size_y * size_x;
  if (uVar3 == 0) {
    pCVar2 = assign(this);
    return pCVar2;
  }
  if (uVar3 != this->_height * this->_width * this->_depth * this->_spectrum) {
    if (this->_is_shared == true) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      pcVar4 = "non-";
      if (this->_is_shared != false) {
        pcVar4 = "";
      }
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::assign() : Invalid assignement request of shared instance from specified image (%u,%u,%u,%u)."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar4,"long",(ulong)size_x,(ulong)size_y,
                 (ulong)size_z,(ulong)size_c);
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
    }
    if (this->_data != (long *)0x0) {
      operator_delete__(this->_data);
    }
    plVar1 = (long *)operator_new__((ulong)uVar3 << 3);
    this->_data = plVar1;
  }
  this->_width = size_x;
  this->_height = size_y;
  this->_depth = size_z;
  this->_spectrum = size_c;
  return this;
}

Assistant:

CImg<T>& assign(const unsigned int size_x, const unsigned int size_y=1, const unsigned int size_z=1, const unsigned int size_c=1) {
      const unsigned int siz = size_x*size_y*size_z*size_c;
      if (!siz) return assign();
      const unsigned int curr_siz = size();
      if (siz!=curr_siz) {
        if (_is_shared)
          throw CImgArgumentException(_cimg_instance
                                      "assign() : Invalid assignement request of shared instance from specified image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      size_x,size_y,size_z,size_c);
        else {
          delete[] _data;
          try { _data = new T[siz]; } catch (...) {
            _width = _height = _depth = _spectrum = 0; _data = 0;
            throw CImgInstanceException(_cimg_instance
                                        "assign() : Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                        cimg_instance,
                                        cimg::strbuffersize(size_x*size_y*size_z*size_c*sizeof(T)),size_x,size_y,size_z,size_c);
          }
        }
      }
      _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
      return *this;
    }